

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

iterator __thiscall
google::protobuf::RepeatedField<float>::erase
          (RepeatedField<float> *this,const_iterator first,const_iterator last)

{
  int iVar1;
  const_iterator pfVar2;
  iterator pfVar3;
  float *pfVar4;
  size_type first_offset;
  const_iterator last_local;
  const_iterator first_local;
  RepeatedField<float> *this_local;
  
  pfVar2 = cbegin(this);
  iVar1 = (int)((long)first - (long)pfVar2 >> 2);
  if (first != last) {
    pfVar2 = cend(this);
    pfVar3 = begin(this);
    pfVar4 = std::copy<float_const*,float*>(last,pfVar2,pfVar3 + iVar1);
    pfVar2 = cbegin(this);
    Truncate(this,(int)((long)pfVar4 - (long)pfVar2 >> 2));
  }
  pfVar3 = begin(this);
  return pfVar3 + iVar1;
}

Assistant:

inline typename RepeatedField<Element>::iterator RepeatedField<Element>::erase(
    const_iterator first, const_iterator last) {
  size_type first_offset = first - cbegin();
  if (first != last) {
    Truncate(std::copy(last, cend(), begin() + first_offset) - cbegin());
  }
  return begin() + first_offset;
}